

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t uVar1;
  uint32_t RegNo;
  uint32_t RegNo_00;
  uint32_t RegNo_01;
  uint uVar2;
  uint shift;
  uint extend;
  uint Rm;
  uint Rn;
  uint Rd;
  void *Decoder_local;
  uint64_t Addr_local;
  uint32_t insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction(insn,10,6);
  if (4 < (uVar1 & 7)) {
    return MCDisassembler_Fail;
  }
  RegNo = fieldFromInstruction(insn,0,5);
  RegNo_00 = fieldFromInstruction(insn,5,5);
  RegNo_01 = fieldFromInstruction(insn,0x10,5);
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 == 0x31) {
LAB_001a6327:
    DecodeGPR32RegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeGPR32spRegisterClass(Inst,RegNo_00,Addr,Decoder);
    DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
  }
  else {
    if (uVar2 == 0x35) {
LAB_001a63a9:
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
      DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
      goto LAB_001a6461;
    }
    if (uVar2 == 0x36) {
LAB_001a6425:
      DecodeGPR64RegisterClass(Inst,RegNo,Addr,Decoder);
      DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
      DecodeGPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
      goto LAB_001a6461;
    }
    if (uVar2 == 0x3f) {
LAB_001a62e6:
      DecodeGPR32spRegisterClass(Inst,RegNo,Addr,Decoder);
      DecodeGPR32spRegisterClass(Inst,RegNo_00,Addr,Decoder);
      DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
      goto LAB_001a6461;
    }
    if (uVar2 == 0x43) {
LAB_001a6368:
      DecodeGPR64spRegisterClass(Inst,RegNo,Addr,Decoder);
      DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
      DecodeGPR32RegisterClass(Inst,RegNo_01,Addr,Decoder);
      goto LAB_001a6461;
    }
    if (uVar2 != 0x44) {
      if (uVar2 == 0x79e) goto LAB_001a6327;
      if (uVar2 == 0x7a2) goto LAB_001a63a9;
      if (uVar2 == 0x7a3) goto LAB_001a6425;
      if (uVar2 == 0x7a7) goto LAB_001a62e6;
      if (uVar2 == 0x7ab) goto LAB_001a6368;
      if (uVar2 != 0x7ac) {
        return MCDisassembler_Fail;
      }
    }
    DecodeGPR64spRegisterClass(Inst,RegNo,Addr,Decoder);
    DecodeGPR64spRegisterClass(Inst,RegNo_00,Addr,Decoder);
    DecodeGPR64RegisterClass(Inst,RegNo_01,Addr,Decoder);
  }
LAB_001a6461:
  MCOperand_CreateImm0(Inst,(ulong)uVar1);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeAddSubERegInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		void *Decoder)
{
  unsigned Rd, Rn, Rm;
  unsigned extend = fieldFromInstruction(insn, 10, 6);
  unsigned shift = extend & 0x7;

  if (shift > 4)
    return Fail;

  Rd = fieldFromInstruction(insn, 0, 5);
  Rn = fieldFromInstruction(insn, 5, 5);
  Rm = fieldFromInstruction(insn, 16, 5);

  switch (MCInst_getOpcode(Inst)) {
  default:
    return Fail;
  case AArch64_ADDWrx:
  case AArch64_SUBWrx:
    DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSWrx:
  case AArch64_SUBSWrx:
    DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx:
  case AArch64_SUBXrx:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDSXrx:
  case AArch64_SUBSXrx:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR32RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_ADDXrx64:
  case AArch64_SUBXrx64:
    DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  case AArch64_SUBSXrx64:
  case AArch64_ADDSXrx64:
    DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
    DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
    DecodeGPR64RegisterClass(Inst, Rm, Addr, Decoder);
    break;
  }

  MCOperand_CreateImm0(Inst, extend);
  return Success;
}